

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCount(BtCursor *pCur,i64 *pnEntry)

{
  int iVar1;
  uint uVar2;
  u32 uVar3;
  MemPage *local_38;
  MemPage *pPage;
  int iIdx;
  int rc;
  i64 nEntry;
  i64 *pnEntry_local;
  BtCursor *pCur_local;
  
  _iIdx = 0;
  pPage._4_4_ = moveToRoot(pCur);
  if (pPage._4_4_ == 0x10) {
    *pnEntry = 0;
    pCur_local._4_4_ = 0;
  }
  else {
    while (pPage._4_4_ == 0) {
      local_38 = pCur->pPage;
      if ((local_38->leaf != '\0') || (local_38->intKey == '\0')) {
        _iIdx = (ulong)local_38->nCell + _iIdx;
      }
      if (local_38->leaf != '\0') {
        do {
          if (pCur->iPage == '\0') {
            *pnEntry = _iIdx;
            iVar1 = moveToRoot(pCur);
            return iVar1;
          }
          moveToParent(pCur);
        } while (pCur->pPage->nCell <= pCur->ix);
        pCur->ix = pCur->ix + 1;
        local_38 = pCur->pPage;
      }
      uVar2 = (uint)pCur->ix;
      if (uVar2 == local_38->nCell) {
        uVar3 = sqlite3Get4byte(local_38->aData + (int)(local_38->hdrOffset + 8));
        pPage._4_4_ = moveToChild(pCur,uVar3);
      }
      else {
        uVar3 = sqlite3Get4byte(local_38->aData +
                                (int)(uint)(local_38->maskPage &
                                           CONCAT11(local_38->aCellIdx[(int)(uVar2 << 1)],
                                                    local_38->aCellIdx[(long)(int)(uVar2 << 1) + 1])
                                           ));
        pPage._4_4_ = moveToChild(pCur,uVar3);
      }
    }
    pCur_local._4_4_ = pPage._4_4_;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  rc = moveToRoot(pCur);
  if( rc==SQLITE_EMPTY ){
    *pnEntry = 0;
    return SQLITE_OK;
  }

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages). 
  */
  while( rc==SQLITE_OK ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then 
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->pPage;
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it 
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return moveToRoot(pCur);
        }
        moveToParent(pCur);
      }while ( pCur->ix>=pCur->pPage->nCell );

      pCur->ix++;
      pPage = pCur->pPage;
    }

    /* Descend to the child node of the cell that the cursor currently 
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->ix;
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}